

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_manager.cc
# Opt level: O0

RC __thiscall
RM_Manager::SetUpFH(RM_Manager *this,RM_FileHandle *fileHandle,PF_FileHandle *fh,
                   RM_FileHeader *header)

{
  int iVar1;
  PageNum PVar2;
  bool bVar3;
  RM_FileHeader *header_local;
  PF_FileHandle *fh_local;
  RM_FileHandle *fileHandle_local;
  RM_Manager *this_local;
  
  iVar1 = header->numRecordsPerPage;
  (fileHandle->header).recordSize = header->recordSize;
  (fileHandle->header).numRecordsPerPage = iVar1;
  PVar2 = header->firstFreePage;
  (fileHandle->header).numPages = header->numPages;
  (fileHandle->header).firstFreePage = PVar2;
  iVar1 = header->bitmapSize;
  (fileHandle->header).bitmapOffset = header->bitmapOffset;
  (fileHandle->header).bitmapSize = iVar1;
  PF_FileHandle::operator=(&fileHandle->pfh,fh);
  fileHandle->header_modified = false;
  fileHandle->openedFH = true;
  bVar3 = RM_FileHandle::isValidFileHeader(fileHandle);
  if (bVar3) {
    this_local._4_4_ = 0;
  }
  else {
    fileHandle->openedFH = false;
    this_local._4_4_ = 0x6a;
  }
  return this_local._4_4_;
}

Assistant:

RC RM_Manager::SetUpFH(RM_FileHandle& fileHandle, PF_FileHandle &fh, struct RM_FileHeader* header){
  // set up the private variables
  memcpy(&fileHandle.header, header, sizeof(struct RM_FileHeader));
  fileHandle.pfh = fh;
  fileHandle.header_modified = false;
  fileHandle.openedFH = true;

  // confirms that the header is valid
  if(! fileHandle.isValidFileHeader()){
    fileHandle.openedFH = false;
    return (RM_INVALIDFILE);
  }
  return (0);
}